

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O2

int __thiscall xmrig::Base::init(Base *this,EVP_PKEY_CTX *ctx)

{
  Api *this_00;
  CpuConfig *pCVar1;
  ConsoleLog *this_01;
  FileLog *this_02;
  Config *pCVar2;
  ILogBackend *backend;
  BasePrivate *pBVar3;
  
  this_00 = (Api *)operator_new(0xd8);
  Api::Api(this_00,this);
  this->d_ptr->api = this_00;
  Api::addListener(this_00,&this->super_IApiListener);
  Platform::init((EVP_PKEY_CTX *)(this->d_ptr->config->super_BaseConfig).m_userAgent.m_data);
  pCVar1 = Config::cpu(this->d_ptr->config);
  Platform::setProcessPriority(pCVar1->m_priority);
  pBVar3 = this->d_ptr;
  pCVar2 = pBVar3->config;
  if ((pCVar2 == (Config *)0x0) || ((pCVar2->super_BaseConfig).m_background != true)) {
    this_01 = (ConsoleLog *)operator_new(0x10);
    ConsoleLog::ConsoleLog(this_01);
    Log::add((ILogBackend *)this_01);
    pBVar3 = this->d_ptr;
    pCVar2 = pBVar3->config;
  }
  else {
    Log::background = 1;
  }
  if ((pCVar2->super_BaseConfig).m_logFile.m_data != (char *)0x0) {
    this_02 = (FileLog *)operator_new(0x10);
    FileLog::FileLog(this_02,(pBVar3->config->super_BaseConfig).m_logFile.m_data);
    Log::add((ILogBackend *)this_02);
    pCVar2 = this->d_ptr->config;
  }
  if ((pCVar2->super_BaseConfig).m_syslog == true) {
    backend = (ILogBackend *)operator_new(8);
    SysLog::SysLog((SysLog *)backend);
    Log::add(backend);
  }
  return 0;
}

Assistant:

int xmrig::Base::init()
{
#   ifdef XMRIG_FEATURE_API
    d_ptr->api = new Api(this);
    d_ptr->api->addListener(this);
#   endif

    Platform::init(config()->userAgent());

    Platform::setProcessPriority(config()->cpu().priority());

    if (isBackground()) {
        Log::background = true;
    }
    else {
        Log::add(new ConsoleLog());
    }

    if (config()->logFile()) {
        Log::add(new FileLog(config()->logFile()));
    }

#   ifdef HAVE_SYSLOG_H
    if (config()->isSyslog()) {
        Log::add(new SysLog());
    }
#   endif

    return 0;
}